

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

void gaminv(double *a,double *x,double *x0,double *p,double *q,int *ierr)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double local_58;
  
  gaminv::e = spmpar(&gaminv::K1);
  gaminv::xmin = spmpar(&gaminv::K2);
  dVar2 = spmpar(&gaminv::K3);
  gaminv::xmax = dVar2;
  *x = 0.0;
  dVar5 = gaminv::e;
  dVar3 = *a;
  if (dVar3 <= 0.0) {
    *ierr = -2;
    return;
  }
  dVar10 = *p;
  dVar4 = *q;
  gaminv::t = dVar10 + dVar4 + -1.0;
  if (gaminv::e < ABS(gaminv::t)) {
    *ierr = -4;
    return;
  }
  *ierr = 0;
  if ((dVar10 == 0.0) && (!NAN(dVar10))) {
    return;
  }
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    *x = dVar2;
    return;
  }
  if ((dVar3 == 1.0) && (!NAN(dVar3))) {
    if (0.9 <= dVar4) {
      gaminv::T9 = -dVar10;
      dVar3 = alnrel(&gaminv::T9);
    }
    else {
      dVar3 = log(dVar4);
    }
    *x = -dVar3;
    return;
  }
  gaminv::e2 = dVar5 + dVar5;
  gaminv::amax = 4e-11 / (dVar5 * dVar5);
  gaminv::iop = (1e-10 < dVar5) + 1;
  gaminv::eps = gaminv::eps0[1e-10 < dVar5];
  gaminv::xn = *x0;
  if (gaminv::xn <= 0.0) {
    if (*a <= 1.0) {
      gaminv::T4 = *a + 1.0;
      dVar2 = Xgamm(&gaminv::T4);
      dVar3 = *q;
      dVar10 = dVar2 * dVar3;
      dVar5 = gaminv::xmax;
      if ((dVar10 == 0.0) && (!NAN(dVar10))) goto LAB_0010ba55;
      dVar4 = *a;
      gaminv::b = dVar10 / dVar4;
      if (dVar10 <= dVar4 * 0.6) {
        if ((dVar4 < 0.3) && (0.35 <= gaminv::b)) {
          dVar5 = exp(-(gaminv::b + 0.577215664901533));
          gaminv::t = dVar5;
          dVar2 = exp(dVar5);
          dVar3 = gaminv::t;
          gaminv::u = dVar2 * dVar5;
          dVar5 = exp(gaminv::u);
          gaminv::xn = dVar5 * dVar3;
          goto LAB_0010ae0a;
        }
        if (gaminv::b < 0.45) {
          if ((gaminv::b == 0.0) && (!NAN(gaminv::b))) goto LAB_0010ba55;
          dVar3 = log(gaminv::b);
          gaminv::y = -dVar3;
          gaminv::s = (0.5 - *a) + 0.5;
          dVar3 = log(gaminv::y);
          local_58 = gaminv::y;
          dVar5 = -gaminv::s;
          gaminv::t = gaminv::y - gaminv::s * dVar3;
          if (0.15 <= gaminv::b) {
            dVar2 = log(gaminv::t);
            dVar3 = gaminv::s / (gaminv::t + 1.0) + 1.0;
          }
          else {
            if (gaminv::b <= 0.01) goto LAB_0010bc89;
            dVar3 = *a;
            dVar2 = 3.0 - dVar3;
            gaminv::u = ((dVar2 + dVar2 + gaminv::t) * gaminv::t + (2.0 - dVar3) * dVar2) /
                        (((5.0 - dVar3) + gaminv::t) * gaminv::t + 2.0);
            dVar2 = log(gaminv::t);
            dVar3 = gaminv::u;
          }
          local_58 = dVar5 * dVar2 + local_58;
          dVar3 = log(dVar3);
          goto LAB_0010b4af;
        }
      }
      if (gaminv::b * dVar3 <= 1e-08) {
        dVar3 = -(dVar3 / dVar4 + 0.577215664901533);
      }
      else {
        if (*p <= 0.9) {
          dVar3 = log(dVar2 * *p);
        }
        else {
          gaminv::T5 = -dVar3;
          dVar5 = alnrel(&gaminv::T5);
          dVar3 = gamln1(a);
          dVar3 = dVar3 + dVar5;
        }
        dVar3 = dVar3 / *a;
      }
      gaminv::xn = exp(dVar3);
      if ((gaminv::xn == 0.0) && (!NAN(gaminv::xn))) {
        *ierr = -3;
        return;
      }
      gaminv::t = (0.5 - gaminv::xn / (*a + 1.0)) + 0.5;
      gaminv::xn = gaminv::xn / gaminv::t;
      goto LAB_0010ae0a;
    }
    dVar3 = *q;
    if (0.5 < dVar3) {
      dVar3 = *p;
    }
    gaminv::w = log(dVar3);
    dVar3 = gaminv::w * -2.0;
    if (dVar3 < 0.0) {
      gaminv::t = sqrt(dVar3);
    }
    else {
      gaminv::t = SQRT(dVar3);
    }
    gaminv::s = gaminv::t -
                (((gaminv::t * 0.213623493715853 + 4.28342155967104) * gaminv::t + 11.6616720288968)
                 * gaminv::t + 3.31125922108741) /
                ((((gaminv::t * 0.036117081018842 + 1.27364489782223) * gaminv::t + 6.40691597760039
                  ) * gaminv::t + 6.61053765625462) * gaminv::t + 1.0);
    if (0.5 < *q) {
      gaminv::s = -gaminv::s;
    }
    dVar3 = *a;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar2 = gaminv::s * gaminv::s;
    dVar5 = *a;
    auVar8._0_8_ = ((dVar2 * 9.0 + 256.0) * dVar2 + -433.0) * gaminv::s;
    auVar6._0_8_ = dVar2 + -1.0;
    auVar6._8_8_ = (dVar2 + -7.0) * gaminv::s;
    auVar7._8_8_ = dVar3 * 36.0;
    auVar7._0_8_ = 0x4008000000000000;
    auVar7 = divpd(auVar6,auVar7);
    auVar8._8_8_ = (dVar2 * 3.0 + 7.0) * dVar2 + -16.0;
    auVar9._8_8_ = dVar5 * 810.0;
    auVar9._0_8_ = dVar5 * 38880.0 * dVar3;
    auVar9 = divpd(auVar8,auVar9);
    dVar5 = ((auVar7._8_8_ + gaminv::s * dVar3 + dVar5 + auVar7._0_8_) - auVar9._8_8_) +
            auVar9._0_8_;
    dVar3 = 0.0;
    if (0.0 <= dVar5) {
      dVar3 = dVar5;
    }
    dVar5 = *a;
    lVar1 = (long)gaminv::iop;
    gaminv::xn = dVar3;
    if (*(double *)(dt1::ideg + lVar1 * 2 + 2) <= dVar5) {
      *x = dVar3;
      dVar5 = *a;
      if (ABS((0.5 - dVar3 / dVar5) + 0.5) <= gaminv::bmin[lVar1 + 1]) {
        return;
      }
    }
    dVar3 = gaminv::w;
    if (*p <= 0.5) {
      gaminv::ap1 = dVar5 + 1.0;
      if (gaminv::xn <= gaminv::ap1 * 0.7) {
        dVar3 = gamln(&gaminv::ap1);
        gaminv::w = dVar3 + gaminv::w;
        if (gaminv::xn <= gaminv::ap1 * 0.15) {
          dVar3 = *a;
          gaminv::ap2 = dVar3 + 2.0;
          gaminv::ap3 = dVar3 + 3.0;
          dVar3 = exp((gaminv::w + *x) / dVar3);
          *x = dVar3;
          dVar5 = gaminv::w + dVar3;
          dVar3 = log((dVar3 / gaminv::ap2 + 1.0) * (dVar3 / gaminv::ap1) + 1.0);
          dVar3 = exp((dVar5 - dVar3) / *a);
          *x = dVar3;
          dVar5 = gaminv::w + dVar3;
          dVar3 = log((dVar3 / gaminv::ap2 + 1.0) * (dVar3 / gaminv::ap1) + 1.0);
          dVar3 = exp((dVar5 - dVar3) / *a);
          *x = dVar3;
          dVar5 = gaminv::w + dVar3;
          dVar3 = log(((dVar3 / gaminv::ap3 + 1.0) * (dVar3 / gaminv::ap2) + 1.0) *
                      (dVar3 / gaminv::ap1) + 1.0);
          gaminv::xn = exp((dVar5 - dVar3) / *a);
          *x = gaminv::xn;
          if (gaminv::xn <= gaminv::ap1 * 0.01) {
            if (gaminv::xn <= gaminv::ap1 * gaminv::dmin[(long)gaminv::iop + 1]) {
              return;
            }
            goto LAB_0010b808;
          }
        }
        dVar3 = gaminv::w;
        dVar10 = gaminv::xn / gaminv::ap1;
        dVar2 = dVar10 + 1.0;
        dVar5 = gaminv::ap1;
        do {
          dVar5 = dVar5 + 1.0;
          dVar10 = dVar10 * (gaminv::xn / dVar5);
          dVar2 = dVar2 + dVar10;
        } while (0.0001 < dVar10);
        dVar5 = log(dVar2);
        gaminv::t = dVar3 - dVar5;
        gaminv::xn = exp((gaminv::t + gaminv::xn) / *a);
        dVar3 = *a;
        dVar5 = log(gaminv::xn);
        gaminv::xn = (1.0 - ((dVar5 * dVar3 - gaminv::xn) - gaminv::t) / (*a - gaminv::xn)) *
                     gaminv::xn;
      }
      goto LAB_0010b808;
    }
    if (dVar5 * 3.0 <= gaminv::xn) {
      dVar5 = gamln(a);
      dVar2 = -(dVar5 + dVar3);
      dVar3 = *a;
      dVar10 = dVar3 + -1.0;
      dVar5 = dVar3 * dVar10;
      if (dVar5 <= 2.0) {
        dVar5 = 2.0;
      }
      gaminv::y = dVar2;
      if (dVar5 * 2.302585 <= dVar2) {
        gaminv::s = 1.0 - dVar3;
        dVar3 = log(dVar2);
        dVar5 = -gaminv::s;
LAB_0010bc89:
        dVar3 = dVar3 * dVar5;
        dVar2 = *a;
        dVar10 = dVar2 * -1.5 + 2.5;
        auVar11._0_8_ = (dVar2 * 11.0 + -46.0) * dVar2 + 47.0;
        auVar11._8_8_ = ((dVar2 * 25.0 + -195.0) * dVar2 + 477.0) * dVar2 + -379.0;
        auVar9 = divpd(auVar11,_DAT_00112f30);
        gaminv::xn = ((((dVar5 * (((((dVar2 * 11.0 + -17.0) / 6.0 + dVar3 * -0.25) * dVar3 +
                                   (dVar2 * -3.0 + 13.0) * dVar2 + -13.0) * dVar3 +
                                  (((dVar2 + dVar2 + -25.0) * dVar2 + 72.0) * dVar2 + -61.0) * 0.5)
                                  * dVar3 + auVar9._8_8_)) / gaminv::y +
                       dVar5 * (((dVar3 / 3.0 + dVar10) * dVar3 + (dVar2 + -6.0) * dVar2 + 7.0) *
                                dVar3 + auVar9._0_8_)) / gaminv::y +
                      ((dVar3 * 0.5 + (2.0 - dVar2)) * dVar3 + dVar10) * gaminv::s) / gaminv::y +
                     (dVar3 + 1.0) * dVar5) / gaminv::y + dVar3 + gaminv::y;
        if ((*a <= 1.0) &&
           (gaminv::b < gaminv::amin[(long)gaminv::iop + 1] ||
            gaminv::b == gaminv::amin[(long)gaminv::iop + 1])) {
          *x = gaminv::xn;
          return;
        }
      }
      else {
        gaminv::T6 = -dVar10 / (gaminv::xn + 1.0);
        gaminv::t = dVar10;
        dVar5 = log(gaminv::xn);
        dVar4 = alnrel(&gaminv::T6);
        local_58 = gaminv::y;
        dVar3 = gaminv::t;
        dVar4 = (dVar5 * dVar10 + dVar2) - dVar4;
        gaminv::T7 = -gaminv::t / (dVar4 + 1.0);
        dVar5 = log(dVar4);
        local_58 = dVar5 * dVar3 + local_58;
        dVar3 = alnrel(&gaminv::T7);
LAB_0010b4af:
        gaminv::xn = local_58 - dVar3;
      }
    }
  }
  else {
LAB_0010ae0a:
    if (*p <= 0.5) {
LAB_0010b808:
      dVar5 = gaminv::xn;
      if (gaminv::xmin * 10000000000.0 < *p) {
        dVar3 = *a;
        gaminv::am1 = dVar3 + -0.5 + -0.5;
        while ((dVar3 <= gaminv::amax ||
               (dVar5 = gaminv::xn, gaminv::e2 < ABS((0.5 - gaminv::xn / dVar3) + 0.5)))) {
          if (0x13 < *ierr) goto LAB_0010ba6f;
          *ierr = *ierr + 1;
          gratio(a,&gaminv::xn,&gaminv::pn,&gaminv::qn,&gaminv::K8);
          dVar5 = gaminv::xn;
          if (((gaminv::pn == 0.0) && (!NAN(gaminv::pn))) ||
             ((gaminv::qn == 0.0 && (!NAN(gaminv::qn))))) break;
          dVar3 = rcomp(a,&gaminv::xn);
          if ((dVar3 == 0.0) && (dVar5 = gaminv::xn, !NAN(dVar3))) break;
          dVar3 = (gaminv::pn - *p) / dVar3;
          dVar2 = (gaminv::am1 - gaminv::xn) * 0.5;
          dVar5 = ABS(dVar3);
          gaminv::t = dVar3;
          gaminv::w = dVar2;
          if ((0.1 < dVar5) || (0.1 < ABS(dVar3 * dVar2))) {
            dVar10 = gaminv::xn * (1.0 - dVar3);
            *x = dVar10;
            if (dVar10 <= 0.0) goto LAB_0010ba78;
          }
          else {
            dVar5 = (dVar3 * dVar2 + 1.0) * dVar3;
            dVar10 = gaminv::xn * (1.0 - dVar5);
            *x = dVar10;
            if (dVar10 <= 0.0) goto LAB_0010ba78;
            if ((1.0 <= ABS(dVar2)) && (ABS(dVar2) * dVar3 * dVar3 <= gaminv::eps)) {
              return;
            }
            dVar5 = ABS(dVar5);
          }
          if (dVar5 <= 1e-05) {
            if (dVar5 <= gaminv::eps) {
              gaminv::xn = dVar10;
              return;
            }
            if (ABS(*p - gaminv::pn) <= *p * 1e-05) {
              gaminv::xn = dVar10;
              return;
            }
          }
          dVar3 = *a;
          gaminv::xn = dVar10;
        }
      }
      goto LAB_0010ba55;
    }
  }
  dVar5 = gaminv::xn;
  if (gaminv::xmin * 10000000000.0 < *q) {
    dVar3 = *a;
    gaminv::am1 = dVar3 + -0.5 + -0.5;
    while ((dVar3 <= gaminv::amax ||
           (dVar5 = gaminv::xn, gaminv::e2 < ABS((0.5 - gaminv::xn / dVar3) + 0.5)))) {
      if (0x13 < *ierr) {
LAB_0010ba6f:
        *ierr = -6;
        return;
      }
      *ierr = *ierr + 1;
      gratio(a,&gaminv::xn,&gaminv::pn,&gaminv::qn,&gaminv::K8);
      dVar5 = gaminv::xn;
      if (((gaminv::pn == 0.0) && (!NAN(gaminv::pn))) || ((gaminv::qn == 0.0 && (!NAN(gaminv::qn))))
         ) break;
      dVar3 = rcomp(a,&gaminv::xn);
      if ((dVar3 == 0.0) && (dVar5 = gaminv::xn, !NAN(dVar3))) break;
      dVar3 = (*q - gaminv::qn) / dVar3;
      dVar2 = (gaminv::am1 - gaminv::xn) * 0.5;
      dVar5 = ABS(dVar3);
      gaminv::t = dVar3;
      gaminv::w = dVar2;
      if ((0.1 < dVar5) || (0.1 < ABS(dVar3 * dVar2))) {
        dVar10 = gaminv::xn * (1.0 - dVar3);
        *x = dVar10;
        if (dVar10 <= 0.0) goto LAB_0010ba78;
      }
      else {
        dVar5 = (dVar3 * dVar2 + 1.0) * dVar3;
        dVar10 = gaminv::xn * (1.0 - dVar5);
        *x = dVar10;
        if (dVar10 <= 0.0) {
LAB_0010ba78:
          *ierr = -7;
          return;
        }
        if ((1.0 <= ABS(dVar2)) && (ABS(dVar2) * dVar3 * dVar3 <= gaminv::eps)) {
          return;
        }
        dVar5 = ABS(dVar5);
      }
      if (dVar5 <= 1e-05) {
        if (dVar5 <= gaminv::eps) {
          gaminv::xn = dVar10;
          return;
        }
        if (ABS(*q - gaminv::qn) <= *q * 1e-05) {
          gaminv::xn = dVar10;
          return;
        }
      }
      dVar3 = *a;
      gaminv::xn = dVar10;
    }
  }
LAB_0010ba55:
  *x = dVar5;
  *ierr = -8;
  return;
}

Assistant:

void gaminv(double *a,double *x,double *x0,double *p,double *q,
            int *ierr)
/*
 ----------------------------------------------------------------------
            INVERSE INCOMPLETE GAMMA RATIO FUNCTION

     GIVEN POSITIVE A, AND NONEGATIVE P AND Q WHERE P + Q = 1.
     THEN X IS COMPUTED WHERE P(A,X) = P AND Q(A,X) = Q. SCHRODER
     ITERATION IS EMPLOYED. THE ROUTINE ATTEMPTS TO COMPUTE X
     TO 10 SIGNIFICANT DIGITS IF THIS IS POSSIBLE FOR THE
     PARTICULAR COMPUTER ARITHMETIC BEING USED.

                      ------------

     X IS A VARIABLE. IF P = 0 THEN X IS ASSIGNED THE VALUE 0,
     AND IF Q = 0 THEN X IS SET TO THE LARGEST FLOATING POINT
     NUMBER AVAILABLE. OTHERWISE, GAMINV ATTEMPTS TO OBTAIN
     A SOLUTION FOR P(A,X) = P AND Q(A,X) = Q. IF THE ROUTINE
     IS SUCCESSFUL THEN THE SOLUTION IS STORED IN X.

     X0 IS AN OPTIONAL INITIAL APPROXIMATION FOR X. IF THE USER
     DOES NOT WISH TO SUPPLY AN INITIAL APPROXIMATION, THEN SET
     X0 .LE. 0.

     IERR IS A VARIABLE THAT REPORTS THE STATUS OF THE RESULTS.
     WHEN THE ROUTINE TERMINATES, IERR HAS ONE OF THE FOLLOWING
     VALUES ...

       IERR =  0    THE SOLUTION WAS OBTAINED. ITERATION WAS
                    NOT USED.
       IERR.GT.0    THE SOLUTION WAS OBTAINED. IERR ITERATIONS
                    WERE PERFORMED.
       IERR = -2    (INPUT ERROR) A .LE. 0
       IERR = -3    NO SOLUTION WAS OBTAINED. THE RATIO Q/A
                    IS TOO LARGE.
       IERR = -4    (INPUT ERROR) P + Q .NE. 1
       IERR = -6    20 ITERATIONS WERE PERFORMED. THE MOST
                    RECENT VALUE OBTAINED FOR X IS GIVEN.
                    THIS CANNOT OCCUR IF X0 .LE. 0.
       IERR = -7    ITERATION FAILED. NO VALUE IS GIVEN FOR X.
                    THIS MAY OCCUR WHEN X IS APPROXIMATELY 0.
       IERR = -8    A VALUE FOR X HAS BEEN OBTAINED, BUT THE
                    ROUTINE IS NOT CERTAIN OF ITS ACCURACY.
                    ITERATION CANNOT BE PERFORMED IN THIS
                    CASE. IF X0 .LE. 0, THIS CAN OCCUR ONLY
                    WHEN P OR Q IS APPROXIMATELY 0. IF X0 IS
                    POSITIVE THEN THIS CAN OCCUR WHEN A IS
                    EXCEEDINGLY CLOSE TO X AND A IS EXTREMELY
                    LARGE (SAY A .GE. 1.E20).
 ----------------------------------------------------------------------
     WRITTEN BY ALFRED H. MORRIS, JR.
        NAVAL SURFACE WEAPONS CENTER
        DAHLGREN, VIRGINIA
     -------------------
*/
{
static double a0 = 3.31125922108741e0;
static double a1 = 11.6616720288968e0;
static double a2 = 4.28342155967104e0;
static double a3 = .213623493715853e0;
static double b1 = 6.61053765625462e0;
static double b2 = 6.40691597760039e0;
static double b3 = 1.27364489782223e0;
static double b4 = .036117081018842e0;
static double c = .577215664901533e0;
static double ln10 = 2.302585e0;
static double tol = 1.e-5;
static double amin[2] = {
    500.0e0,100.0e0
};
static double bmin[2] = {
    1.e-28,1.e-13
};
static double dmin[2] = {
    1.e-06,1.e-04
};
static double emin[2] = {
    2.e-03,6.e-03
};
static double eps0[2] = {
    1.e-10,1.e-08
};
static int K1 = 1;
static int K2 = 2;
static int K3 = 3;
static int K8 = 0;
static double am1,amax,ap1,ap2,ap3,apn,b,c1,c2,c3,c4,c5,d,e,e2,eps,g,h,pn,qg,qn,
    r,rta,s,s2,sum,t,u,w,xmax,xmin,xn,y,z;
static int iop;
static double T4,T5,T6,T7,T9;
/*
     ..
     .. Executable Statements ..
*/
/*
     ****** E, XMIN, AND XMAX ARE MACHINE DEPENDENT CONSTANTS.
            E IS THE SMALLEST NUMBER FOR WHICH 1.0 + E .GT. 1.0.
            XMIN IS THE SMALLEST POSITIVE NUMBER AND XMAX IS THE
            LARGEST POSITIVE NUMBER.
*/
    e = spmpar(&K1);
    xmin = spmpar(&K2);
    xmax = spmpar(&K3);
    *x = 0.0e0;
    if(*a <= 0.0e0) goto S300;
    t = *p+*q-1.e0;
    if(fabs(t) > e) goto S320;
    *ierr = 0;
    if(*p == 0.0e0) return;
    if(*q == 0.0e0) goto S270;
    if(*a == 1.0e0) goto S280;
    e2 = 2.0e0*e;
    amax = 0.4e-10/(e*e);
    iop = 1;
    if(e > 1.e-10) iop = 2;
    eps = eps0[iop-1];
    xn = *x0;
    if(*x0 > 0.0e0) goto S160;
/*
        SELECTION OF THE INITIAL APPROXIMATION XN OF X
                       WHEN A .LT. 1
*/
    if(*a > 1.0e0) goto S80;
    T4 = *a+1.0e0;
    g = Xgamm(&T4);
    qg = *q*g;
    if(qg == 0.0e0) goto S360;
    b = qg/ *a;
    if(qg > 0.6e0**a) goto S40;
    if(*a >= 0.30e0 || b < 0.35e0) goto S10;
    t = exp(-(b+c));
    u = t*exp(t);
    xn = t*exp(u);
    goto S160;
S10:
    if(b >= 0.45e0) goto S40;
    if(b == 0.0e0) goto S360;
    y = -log(b);
    s = 0.5e0+(0.5e0-*a);
    z = log(y);
    t = y-s*z;
    if(b < 0.15e0) goto S20;
    xn = y-s*log(t)-log(1.0e0+s/(t+1.0e0));
    goto S220;
S20:
    if(b <= 0.01e0) goto S30;
    u = ((t+2.0e0*(3.0e0-*a))*t+(2.0e0-*a)*(3.0e0-*a))/((t+(5.0e0-*a))*t+2.0e0);
    xn = y-s*log(t)-log(u);
    goto S220;
S30:
    c1 = -(s*z);
    c2 = -(s*(1.0e0+c1));
    c3 = s*((0.5e0*c1+(2.0e0-*a))*c1+(2.5e0-1.5e0**a));
    c4 = -(s*(((c1/3.0e0+(2.5e0-1.5e0**a))*c1+((*a-6.0e0)**a+7.0e0))*c1+(
      (11.0e0**a-46.0)**a+47.0e0)/6.0e0));
    c5 = -(s*((((-(c1/4.0e0)+(11.0e0**a-17.0e0)/6.0e0)*c1+((-(3.0e0**a)+13.0e0)*
      *a-13.0e0))*c1+0.5e0*(((2.0e0**a-25.0e0)**a+72.0e0)**a-61.0e0))*c1+((
      (25.0e0**a-195.0e0)**a+477.0e0)**a-379.0e0)/12.0e0));
    xn = (((c5/y+c4)/y+c3)/y+c2)/y+c1+y;
    if(*a > 1.0e0) goto S220;
    if(b > bmin[iop-1]) goto S220;
    *x = xn;
    return;
S40:
    if(b**q > 1.e-8) goto S50;
    xn = exp(-(*q/ *a+c));
    goto S70;
S50:
    if(*p <= 0.9e0) goto S60;
    T5 = -*q;
    xn = exp((alnrel(&T5)+gamln1(a))/ *a);
    goto S70;
S60:
    xn = exp(log(*p*g)/ *a);
S70:
    if(xn == 0.0e0) goto S310;
    t = 0.5e0+(0.5e0-xn/(*a+1.0e0));
    xn /= t;
    goto S160;
S80:
/*
        SELECTION OF THE INITIAL APPROXIMATION XN OF X
                       WHEN A .GT. 1
*/
    if(*q <= 0.5e0) goto S90;
    w = log(*p);
    goto S100;
S90:
    w = log(*q);
S100:
    t = sqrt(-(2.0e0*w));
    s = t-(((a3*t+a2)*t+a1)*t+a0)/((((b4*t+b3)*t+b2)*t+b1)*t+1.0e0);
    if(*q > 0.5e0) s = -s;
    rta = sqrt(*a);
    s2 = s*s;
    xn = *a+s*rta+(s2-1.0e0)/3.0e0+s*(s2-7.0e0)/(36.0e0*rta)-((3.0e0*s2+7.0e0)*
      s2-16.0e0)/(810.0e0**a)+s*((9.0e0*s2+256.0e0)*s2-433.0e0)/(38880.0e0**a*
      rta);
    xn = fifdmax1(xn,0.0e0);
    if(*a < amin[iop-1]) goto S110;
    *x = xn;
    d = 0.5e0+(0.5e0-*x/ *a);
    if(fabs(d) <= dmin[iop-1]) return;
S110:
    if(*p <= 0.5e0) goto S130;
    if(xn < 3.0e0**a) goto S220;
    y = -(w+gamln(a));
    d = fifdmax1(2.0e0,*a*(*a-1.0e0));
    if(y < ln10*d) goto S120;
    s = 1.0e0-*a;
    z = log(y);
    goto S30;
S120:
    t = *a-1.0e0;
    T6 = -(t/(xn+1.0e0));
    xn = y+t*log(xn)-alnrel(&T6);
    T7 = -(t/(xn+1.0e0));
    xn = y+t*log(xn)-alnrel(&T7);
    goto S220;
S130:
    ap1 = *a+1.0e0;
    if(xn > 0.70e0*ap1) goto S170;
    w += gamln(&ap1);
    if(xn > 0.15e0*ap1) goto S140;
    ap2 = *a+2.0e0;
    ap3 = *a+3.0e0;
    *x = exp((w+*x)/ *a);
    *x = exp((w+*x-log(1.0e0+*x/ap1*(1.0e0+*x/ap2)))/ *a);
    *x = exp((w+*x-log(1.0e0+*x/ap1*(1.0e0+*x/ap2)))/ *a);
    *x = exp((w+*x-log(1.0e0+*x/ap1*(1.0e0+*x/ap2*(1.0e0+*x/ap3))))/ *a);
    xn = *x;
    if(xn > 1.e-2*ap1) goto S140;
    if(xn <= emin[iop-1]*ap1) return;
    goto S170;
S140:
    apn = ap1;
    t = xn/apn;
    sum = 1.0e0+t;
S150:
    apn += 1.0e0;
    t *= (xn/apn);
    sum += t;
    if(t > 1.e-4) goto S150;
    t = w-log(sum);
    xn = exp((xn+t)/ *a);
    xn *= (1.0e0-(*a*log(xn)-xn-t)/(*a-xn));
    goto S170;
S160:
/*
                 SCHRODER ITERATION USING P
*/
    if(*p > 0.5e0) goto S220;
S170:
    if(*p <= 1.e10*xmin) goto S350;
    am1 = *a-0.5e0-0.5e0;
S180:
    if(*a <= amax) goto S190;
    d = 0.5e0+(0.5e0-xn/ *a);
    if(fabs(d) <= e2) goto S350;
S190:
    if(*ierr >= 20) goto S330;
    *ierr += 1;
    gratio(a,&xn,&pn,&qn,&K8);
    if(pn == 0.0e0 || qn == 0.0e0) goto S350;
    r = rcomp(a,&xn);
    if(r == 0.0e0) goto S350;
    t = (pn-*p)/r;
    w = 0.5e0*(am1-xn);
    if(fabs(t) <= 0.1e0 && fabs(w*t) <= 0.1e0) goto S200;
    *x = xn*(1.0e0-t);
    if(*x <= 0.0e0) goto S340;
    d = fabs(t);
    goto S210;
S200:
    h = t*(1.0e0+w*t);
    *x = xn*(1.0e0-h);
    if(*x <= 0.0e0) goto S340;
    if(fabs(w) >= 1.0e0 && fabs(w)*t*t <= eps) return;
    d = fabs(h);
S210:
    xn = *x;
    if(d > tol) goto S180;
    if(d <= eps) return;
    if(fabs(*p-pn) <= tol**p) return;
    goto S180;
S220:
/*
                 SCHRODER ITERATION USING Q
*/
    if(*q <= 1.e10*xmin) goto S350;
    am1 = *a-0.5e0-0.5e0;
S230:
    if(*a <= amax) goto S240;
    d = 0.5e0+(0.5e0-xn/ *a);
    if(fabs(d) <= e2) goto S350;
S240:
    if(*ierr >= 20) goto S330;
    *ierr += 1;
    gratio(a,&xn,&pn,&qn,&K8);
    if(pn == 0.0e0 || qn == 0.0e0) goto S350;
    r = rcomp(a,&xn);
    if(r == 0.0e0) goto S350;
    t = (*q-qn)/r;
    w = 0.5e0*(am1-xn);
    if(fabs(t) <= 0.1e0 && fabs(w*t) <= 0.1e0) goto S250;
    *x = xn*(1.0e0-t);
    if(*x <= 0.0e0) goto S340;
    d = fabs(t);
    goto S260;
S250:
    h = t*(1.0e0+w*t);
    *x = xn*(1.0e0-h);
    if(*x <= 0.0e0) goto S340;
    if(fabs(w) >= 1.0e0 && fabs(w)*t*t <= eps) return;
    d = fabs(h);
S260:
    xn = *x;
    if(d > tol) goto S230;
    if(d <= eps) return;
    if(fabs(*q-qn) <= tol**q) return;
    goto S230;
S270:
/*
                       SPECIAL CASES
*/
    *x = xmax;
    return;
S280:
    if(*q < 0.9e0) goto S290;
    T9 = -*p;
    *x = -alnrel(&T9);
    return;
S290:
    *x = -log(*q);
    return;
S300:
/*
                       ERROR RETURN
*/
    *ierr = -2;
    return;
S310:
    *ierr = -3;
    return;
S320:
    *ierr = -4;
    return;
S330:
    *ierr = -6;
    return;
S340:
    *ierr = -7;
    return;
S350:
    *x = xn;
    *ierr = -8;
    return;
S360:
    *x = xmax;
    *ierr = -8;
    return;
}